

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_vm.c
# Opt level: O3

_Bool gravity_check_stack(gravity_vm *vm,gravity_fiber_t *fiber,uint32_t stacktopdelta,
                         gravity_value_t **stackstart)

{
  long *plVar1;
  uint uVar2;
  uint32_t uVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  undefined4 in_register_00000014;
  _Bool _Var7;
  long lVar8;
  uint uVar9;
  
  _Var7 = true;
  if ((int)fiber != 0) {
    lVar4 = *(long *)&vm->nccalls + ((ulong)fiber & 0xffffffff) * 0x10;
    *(long *)&vm->nccalls = lVar4;
    lVar6 = *(long *)&vm->aborted;
    uVar2 = (uint)((ulong)(lVar4 - lVar6) >> 4);
    uVar9 = 0x100;
    if (0x100 < uVar2) {
      uVar9 = uVar2;
    }
    uVar2 = (uint)vm->maxrecursion;
    if (uVar2 < uVar9) {
      uVar3 = power_of2_ceil(uVar2 + uVar9);
      if (((uVar3 != 0) && (uVar9 + (int)vm->maxrecursion <= uVar3)) &&
         (pvVar5 = gravity_realloc((gravity_vm *)0x0,*(void **)&vm->aborted,(ulong)uVar3 << 4),
         pvVar5 != (void *)0x0)) {
        *(void **)&vm->aborted = pvVar5;
        *(uint32_t *)&vm->maxrecursion = uVar3;
        lVar6 = (long)pvVar5 - lVar6;
        if (lVar6 == 0) {
          return true;
        }
        uVar9 = vm->nanon;
        if ((ulong)uVar9 != 0) {
          lVar4 = vm->recursioncount;
          lVar8 = 0;
          do {
            plVar1 = (long *)(lVar4 + 0x20 + lVar8);
            *plVar1 = *plVar1 + lVar6;
            lVar8 = lVar8 + 0x30;
          } while ((ulong)uVar9 * 0x30 != lVar8);
        }
        for (lVar4 = *(long *)(vm->temp + 4); lVar4 != 0; lVar4 = *(long *)(lVar4 + 0x48)) {
          *(long *)(lVar4 + 0x30) = *(long *)(lVar4 + 0x30) + lVar6;
        }
        *(long *)&vm->nccalls = *(long *)&vm->nccalls + lVar6;
        *(long *)CONCAT44(in_register_00000014,stacktopdelta) =
             *(long *)CONCAT44(in_register_00000014,stacktopdelta) + lVar6;
        return true;
      }
      *(ulong *)&vm->nccalls = *(long *)&vm->nccalls + ((ulong)fiber & 0xffffffff) * -0x10;
      _Var7 = false;
    }
  }
  return _Var7;
}

Assistant:

static inline bool gravity_check_stack (gravity_vm *vm, gravity_fiber_t *fiber, uint32_t stacktopdelta, gravity_value_t **stackstart) {
    #pragma unused(vm)
	if (stacktopdelta == 0) return true;
	
    // update stacktop pointer before a call
    fiber->stacktop += stacktopdelta;
	
    // check stack size
	uint32_t stack_size = (uint32_t)(fiber->stacktop - fiber->stack);
    uint32_t stack_needed = MAXNUM(stack_size, DEFAULT_MINSTACK_SIZE);
    if (fiber->stackalloc >= stack_needed) return true;
    gravity_value_t *old_stack = fiber->stack;

    // perform stack reallocation (power_of2_ceil returns 0 if argument is bigger than 2^31)
    uint32_t new_size = power_of2_ceil(fiber->stackalloc + stack_needed);
    bool size_condition = (new_size && (uint64_t)new_size >= (uint64_t)(fiber->stackalloc + stack_needed) && ((sizeof(gravity_value_t) * new_size) < SIZE_MAX));
    void *ptr = (size_condition) ? mem_realloc(NULL, fiber->stack, sizeof(gravity_value_t) * new_size) : NULL;
    if (!ptr) {
        // restore stacktop to previous state
        fiber->stacktop -= stacktopdelta;

        // stack reallocation failed means that there is a very high probability to be into an infinite loop
        // so return false and let the calling function (vm_exec) raise a runtime error
        return false;
    }
    
    fiber->stack = (gravity_value_t *)ptr;
    fiber->stackalloc = new_size;
    STAT_STACK_REALLOCATED(vm);

    // check if reallocation moved the stack
    if (fiber->stack == old_stack) return true;

    // re-compute ptr offset
    ptrdiff_t offset = (ptrdiff_t)(fiber->stack - old_stack);

    // adjust stack pointer for each call frame
    for (uint32_t i=0; i < fiber->nframes; ++i) {
        fiber->frames[i].stackstart += offset;
    }

    // adjust upvalues ptr offset
    gravity_upvalue_t *upvalue = fiber->upvalues;
    while (upvalue) {
        upvalue->value += offset;
        upvalue = upvalue->next;
    }

    // adjust fiber stack pointer
    fiber->stacktop += offset;

    // stack is changed so update currently used stackstart
    *stackstart += offset;

    return true;
}